

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

void duckdb::Prefix::TransformToDeprecated
               (ART *art,Node *node,unsafe_unique_ptr<FixedSizeAllocator> *allocator)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> this;
  IndexPointer IVar1;
  Node *node_00;
  ulong uVar2;
  Node current_node;
  Prefix new_prefix;
  Prefix prefix_1;
  IndexPointer local_90;
  Prefix local_88;
  IndexPointer local_70;
  Node *local_68;
  Prefix local_60;
  Prefix local_48;
  
  this._M_head_impl =
       (allocator->
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  if (this._M_head_impl == (FixedSizeAllocator *)0x0) {
    node_00 = node;
    if (((node->super_IndexPointer).data & 0xff00000000000000) == 0x100000000000000) {
      do {
        Prefix(&local_88,art,(Node)(node->super_IndexPointer).data,true,true);
        if (local_88.in_memory != true) {
          return;
        }
        node = local_88.ptr;
        node_00 = local_88.ptr;
      } while ((((local_88.ptr)->super_IndexPointer).data & 0xff00000000000000) == 0x100000000000000
              );
    }
  }
  else {
    IVar1 = FixedSizeAllocator::New(this._M_head_impl);
    local_70.data = IVar1.data & 0xffffffffffffff | 0x100000000000000;
    Prefix(&local_88,allocator,(Node)local_70.data,0xf);
    local_90.data = (node->super_IndexPointer).data;
    local_68 = node;
    while ((local_90.data & 0xff00000000000000) == 0x100000000000000) {
      Prefix(&local_60,art,(Node)local_90.data,true,true);
      if (local_60.in_memory != true) {
        return;
      }
      if (local_60.data[art->prefix_count] != '\0') {
        uVar2 = 0;
        do {
          TransformToDeprecatedAppend(&local_48,&local_88,art,allocator,local_60.data[uVar2]);
          local_88.in_memory = local_48.in_memory;
          local_88.data = local_48.data;
          local_88.ptr = local_48.ptr;
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_60.data[art->prefix_count]);
      }
      ((local_88.ptr)->super_IndexPointer).data = ((local_60.ptr)->super_IndexPointer).data;
      ((local_60.ptr)->super_IndexPointer).data = 0;
      Node::Free(art,(Node *)&local_90);
      local_90.data = ((local_88.ptr)->super_IndexPointer).data;
    }
    (local_68->super_IndexPointer).data = local_70.data;
    node_00 = local_88.ptr;
  }
  Node::TransformToDeprecated(art,node_00,allocator);
  return;
}

Assistant:

void Prefix::TransformToDeprecated(ART &art, Node &node, unsafe_unique_ptr<FixedSizeAllocator> &allocator) {
	// Early-out, if we do not need any transformations.
	if (!allocator) {
		reference<Node> ref(node);
		while (ref.get().GetType() == PREFIX && ref.get().GetGateStatus() == GateStatus::GATE_NOT_SET) {
			Prefix prefix(art, ref, true, true);
			if (!prefix.in_memory) {
				return;
			}
			ref = *prefix.ptr;
		}
		return Node::TransformToDeprecated(art, ref, allocator);
	}

	// We need to create a new prefix (chain).
	Node new_node;
	new_node = allocator->New();
	new_node.SetMetadata(static_cast<uint8_t>(PREFIX));
	Prefix new_prefix(allocator, new_node, DEPRECATED_COUNT);

	Node current_node = node;
	while (current_node.GetType() == PREFIX && current_node.GetGateStatus() == GateStatus::GATE_NOT_SET) {
		Prefix prefix(art, current_node, true, true);
		if (!prefix.in_memory) {
			return;
		}

		for (idx_t i = 0; i < prefix.data[Count(art)]; i++) {
			new_prefix = new_prefix.TransformToDeprecatedAppend(art, allocator, prefix.data[i]);
		}

		*new_prefix.ptr = *prefix.ptr;
		prefix.ptr->Clear();
		Node::Free(art, current_node);
		current_node = *new_prefix.ptr;
	}

	node = new_node;
	return Node::TransformToDeprecated(art, *new_prefix.ptr, allocator);
}